

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hqnx_32_init.cpp
# Opt level: O0

void hqxInit(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t v;
  uint32_t u;
  uint32_t y;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t c;
  
  RGBtoYUV32 = (uint32_t *)operator_new__(0x4000000);
  for (g = 0; g < 0xffffff; g = g + 1) {
    uVar1 = g >> 0x10 & 0xff;
    uVar2 = g >> 8 & 0xff;
    uVar3 = g & 0xff;
    RGBtoYUV32[g] =
         (int)(long)((double)uVar1 * 0.299 + (double)uVar2 * 0.587 + (double)uVar3 * 0.114) *
         0x10000 + ((int)(long)((double)uVar1 * -0.169 + (double)uVar2 * -0.331 +
                               (double)uVar3 * 0.5) + 0x80) * 0x100 +
         (int)(long)((double)uVar1 * 0.5 + (double)uVar2 * -0.419 + (double)uVar3 * -0.081) + 0x80;
  }
  return;
}

Assistant:

HQX_API void HQX_CALLCONV hqxInit(void)
{
    /* Initalize RGB to YUV lookup table */
    uint32_t c, r, g, b, y, u, v;
	RGBtoYUV32 = new uint32_t[16777216];
    for (c = 0; c < 16777215; c++) {
        r = (c & 0xFF0000) >> 16;
        g = (c & 0x00FF00) >> 8;
        b = c & 0x0000FF;
        y = (uint32_t)(0.299*r + 0.587*g + 0.114*b);
        u = (uint32_t)(-0.169*r - 0.331*g + 0.5*b) + 128;
        v = (uint32_t)(0.5*r - 0.419*g - 0.081*b) + 128;
        RGBtoYUV32[c] = (y << 16) + (u << 8) + v;
    }
}